

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
           *__return_storage_ptr__,impl *this,impl *begin,int param_4,long param_5,
          undefined8 param_6)

{
  undefined4 *puVar1;
  unsigned_long *puVar2;
  impl *piVar3;
  int iVar4;
  pointer pTVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  unsigned_long uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  size_type sVar13;
  long lVar14;
  pointer pTVar15;
  ulong uVar16;
  size_type __new_size;
  undefined8 uVar17;
  allocator_type local_65;
  int local_64;
  undefined8 local_60;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> all_samples;
  
  uVar11 = ((long)begin - (long)this) / 0x18;
  local_60 = param_6;
  if (begin == this) {
    assert_fail("local_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0xa9,"sample_block_decomp");
  }
  iVar4 = *(int *)(param_5 + 0x10);
  sVar13 = (size_type)param_4;
  local_64 = param_4;
  std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
            (__return_storage_ptr__,sVar13,(allocator_type *)&all_samples);
  uVar17 = local_60;
  iVar10 = local_64;
  lVar14 = 0;
  for (uVar16 = 0;
      pTVar15 = (__return_storage_ptr__->
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)(((long)(__return_storage_ptr__->
                              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar15) / 0x18);
      uVar16 = uVar16 + 1) {
    lVar12 = (uVar11 / (ulong)(long)(param_4 + 1) +
             (ulong)(uVar16 < uVar11 % (ulong)(long)(param_4 + 1))) * 0x18;
    *(undefined8 *)((long)&pTVar15->SA + lVar14) = *(undefined8 *)(this + lVar12 + -8);
    piVar3 = this + lVar12 + -0x18;
    uVar6 = *(undefined4 *)(piVar3 + 4);
    uVar7 = *(undefined4 *)(piVar3 + 8);
    uVar8 = *(undefined4 *)(piVar3 + 0xc);
    this = this + lVar12;
    puVar1 = (undefined4 *)((long)&pTVar15->B1 + lVar14);
    *puVar1 = *(undefined4 *)piVar3;
    puVar1[1] = uVar6;
    puVar1[2] = uVar7;
    puVar1[3] = uVar8;
    lVar14 = lVar14 + 0x18;
  }
  if (*(int *)(param_5 + 0x14) == 0) {
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
              (&all_samples,(long)(iVar4 * local_64),&local_65);
    uVar17 = local_60;
    MPI_Gather((__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_start,iVar10,local_60,
               all_samples.
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start,iVar10,local_60,0,
               *(undefined8 *)(param_5 + 8));
    std::
    __sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<TwoBSA<unsigned_long>>>>
              (all_samples.
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               all_samples.
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    __new_size = (long)iVar4 - 1;
    if (((long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
              _M_impl.super__Vector_impl_data._M_start) / 0x18 != __new_size) {
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
                (__return_storage_ptr__,__new_size);
    }
    pTVar15 = all_samples.
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start + (sVar13 - 1);
    lVar14 = 0;
    for (uVar11 = 0;
        pTVar5 = (__return_storage_ptr__->
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar11 < (ulong)(((long)(__return_storage_ptr__->
                                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) / 0x18);
        uVar11 = uVar11 + 1) {
      *(unsigned_long *)((long)&pTVar5->SA + lVar14) = pTVar15->SA;
      uVar9 = pTVar15->B2;
      puVar2 = (unsigned_long *)((long)&pTVar5->B1 + lVar14);
      *puVar2 = pTVar15->B1;
      puVar2[1] = uVar9;
      pTVar15 = pTVar15 + sVar13;
      lVar14 = lVar14 + 0x18;
    }
    std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~_Vector_base
              (&all_samples.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>);
  }
  else {
    MPI_Gather(pTVar15,local_64,local_60,0,0,local_60,0,*(undefined8 *)(param_5 + 8));
    sVar13 = (long)iVar4 - 1;
    if (((long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->
              super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
              _M_impl.super__Vector_impl_data._M_start) / 0x18 != sVar13) {
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
                (__return_storage_ptr__,sVar13);
    }
  }
  pTVar15 = (__return_storage_ptr__->
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  MPI_Bcast(pTVar15,((long)(__return_storage_ptr__->
                           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar15) / 0x18 &
                    0xffffffff,uVar17,0,*(undefined8 *)(param_5 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt)
{
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);
    int p = comm.size();

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (std::size_t i = 0; i < local_splitters.size(); ++i) {
        std::size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    if (comm.rank() == 0) {
        std::vector<value_type> all_samples(p*s);
        MPI_Gather(&local_splitters[0], s, mpi_dt,
                   &all_samples[0], s, mpi_dt, 0, comm);

        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }
    else
    {
        // simply send
        MPI_Gather(&local_splitters[0], s, mpi_dt, NULL, 0, mpi_dt, 0, comm);

        // resize splitters for receiving
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}